

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_construct_local_link
              (mg_connection *conn,char *buf,size_t buflen,char *define_proto,int define_port,
              char *define_uri)

{
  byte bVar1;
  sa_family_t sVar2;
  int iVar3;
  mg_domain_context *pmVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *dst;
  __int32_t **pp_Var9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  int truncated;
  size_t local_90;
  char *local_88;
  char *local_80;
  char portstr [16];
  char server_ip [48];
  
  if (conn == (mg_connection *)0x0) {
    return -1;
  }
  if (buf == (char *)0x0) {
    return -1;
  }
  if (buflen == 0) {
    return -1;
  }
  truncated = 0;
  local_88 = define_proto;
  if (define_proto == (char *)0x0) {
    if (conn->protocol_type == 1) {
      pcVar7 = "ws";
      local_88 = "wss";
    }
    else {
      pcVar7 = "http";
      local_88 = "https";
    }
    if ((conn->request_info).is_ssl == 0) {
      local_88 = pcVar7;
    }
  }
  pcVar7 = (conn->request_info).request_uri;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = (conn->request_info).local_uri;
  }
  if (define_port < 1) {
    define_port = (conn->request_info).server_port;
  }
  if (pcVar7 == (char *)0x0) {
    return -1;
  }
  local_80 = buf;
  sVar8 = strlen(pcVar7);
  sVar8 = sVar8 * 3 + 1;
  dst = (char *)malloc(sVar8);
  if (dst == (char *)0x0) {
    return -1;
  }
  local_90 = buflen;
  mg_url_encode(pcVar7,dst,sVar8);
  cVar14 = *dst;
  uVar16 = 0;
  if (cVar14 != '\0') {
    uVar11 = 0;
    pcVar7 = dst;
    do {
      iVar5 = strncmp(pcVar7,"%2f",3);
      if (iVar5 == 0) {
        dst[uVar11] = '/';
        uVar15 = (int)uVar16 + 3;
      }
      else {
        uVar15 = (int)uVar16 + 1;
        dst[uVar11] = cVar14;
      }
      uVar16 = (ulong)uVar15;
      uVar11 = uVar11 + 1;
      pcVar7 = dst + (int)uVar15;
      cVar14 = dst[(int)uVar15];
    } while (cVar14 != '\0');
    uVar16 = uVar11 & 0xffffffff;
  }
  dst[uVar16] = '\0';
  if (define_proto == (char *)0x0) {
    iVar5 = 0x1bb;
    if ((conn->request_info).is_ssl == 0) {
      iVar5 = 0x50;
    }
  }
  else {
    iVar5 = strcmp(define_proto,"https");
    if (iVar5 != 0) {
      iVar6 = strcmp(define_proto,"wss");
      iVar5 = 0x50;
      if (iVar6 != 0) goto LAB_0010bea7;
    }
    iVar5 = 0x1bb;
  }
LAB_0010bea7:
  sVar2 = (conn->client).lsa.sa.sa_family;
  pmVar4 = conn->dom_ctx;
  pcVar7 = pmVar4->config[0x1f];
  if (pcVar7 == (char *)0x0) {
    bVar17 = false;
  }
  else {
    pp_Var9 = __ctype_tolower_loc();
    lVar10 = 0;
    do {
      bVar1 = pcVar7[lVar10];
      iVar6 = (*pp_Var9)[bVar1];
      iVar3 = (*pp_Var9)[(byte)"yes"[lVar10]];
      if (bVar1 == 0) break;
      lVar10 = lVar10 + 1;
    } while (iVar6 == iVar3);
    bVar17 = iVar6 == iVar3;
  }
  pcVar7 = pmVar4->config[0x1e];
  if (define_port == iVar5) {
    portstr[0] = '\0';
  }
  else {
    sprintf(portstr,":%u");
  }
  if (!(bool)(bVar17 & pcVar7 != (char *)0x0)) {
    pcVar7 = server_ip;
    sockaddr_to_string(pcVar7,0x30,&(conn->client).lsa);
  }
  bVar17 = sVar2 != 10;
  pcVar12 = "[";
  if (bVar17 || pcVar7 != server_ip) {
    pcVar12 = "";
  }
  pcVar13 = "]";
  if (bVar17 || pcVar7 != server_ip) {
    pcVar13 = "";
  }
  mg_snprintf(conn,&truncated,local_80,local_90,"%s://%s%s%s%s%s",local_88,pcVar12,pcVar7,pcVar13,
              portstr,dst);
  free(dst);
  return -(uint)(truncated != 0);
}

Assistant:

static int
mg_construct_local_link(const struct mg_connection *conn,
                        char *buf,
                        size_t buflen,
                        const char *define_proto,
                        int define_port,
                        const char *define_uri)
{
	if ((buflen < 1) || (buf == 0) || (conn == 0)) {
		return -1;
	} else {
		int i, j;
		int truncated = 0;
		const struct mg_request_info *ri = &conn->request_info;

		const char *proto =
		    (define_proto != NULL) ? define_proto : get_proto_name(conn);
		const char *uri =
		    (define_uri != NULL)
		        ? define_uri
		        : ((ri->request_uri != NULL) ? ri->request_uri : ri->local_uri);
		int port = (define_port > 0) ? define_port : ri->server_port;
		int default_port = 80;
		char *uri_encoded;
		size_t uri_encoded_len;

		if (uri == NULL) {
			return -1;
		}

		uri_encoded_len = strlen(uri) * 3 + 1;
		uri_encoded = (char *)mg_malloc_ctx(uri_encoded_len, conn->phys_ctx);
		if (uri_encoded == NULL) {
			return -1;
		}
		mg_url_encode(uri, uri_encoded, uri_encoded_len);

		/* Directory separator should be preserved. */
		for (i = j = 0; uri_encoded[i]; j++) {
			if (!strncmp(uri_encoded + i, "%2f", 3)) {
				uri_encoded[j] = '/';
				i += 3;
			} else {
				uri_encoded[j] = uri_encoded[i++];
			}
		}
		uri_encoded[j] = '\0';

#if defined(USE_X_DOM_SOCKET)
		if (conn->client.lsa.sa.sa_family == AF_UNIX) {
			/* TODO: Define and document a link for UNIX domain sockets. */
			/* There seems to be no official standard for this.
			 * Common uses seem to be "httpunix://", "http.unix://" or
			 * "http+unix://" as a protocol definition string, followed by
			 * "localhost" or "127.0.0.1" or "/tmp/unix/path" or
			 * "%2Ftmp%2Funix%2Fpath" (url % encoded) or
			 * "localhost:%2Ftmp%2Funix%2Fpath" (domain socket path as port) or
			 * "" (completely skipping the server name part). In any case, the
			 * last part is the server local path. */
			const char *server_name = UNIX_DOMAIN_SOCKET_SERVER_NAME;
			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
			            "%s.unix://%s%s",
			            proto,
			            server_name,
			            ri->local_uri);
			default_port = 0;
			mg_free(uri_encoded);
			return 0;
		}
#endif

		if (define_proto) {
			/* If we got a protocol name, use the default port accordingly. */
			if ((0 == strcmp(define_proto, "https"))
			    || (0 == strcmp(define_proto, "wss"))) {
				default_port = 443;
			}
		} else if (ri->is_ssl) {
			/* If we did not get a protocol name, use TLS as default if it is
			 * already used. */
			default_port = 443;
		}

		{
#if defined(USE_IPV6)
			int is_ipv6 = (conn->client.lsa.sa.sa_family == AF_INET6);
#endif
			int auth_domain_check_enabled =
			    conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK]
			    && (!mg_strcasecmp(
			           conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK], "yes"));

			const char *server_domain =
			    conn->dom_ctx->config[AUTHENTICATION_DOMAIN];

			char portstr[16];
			char server_ip[48];

			if (port != default_port) {
				sprintf(portstr, ":%u", (unsigned)port);
			} else {
				portstr[0] = 0;
			}

			if (!auth_domain_check_enabled || !server_domain) {

				sockaddr_to_string(server_ip,
				                   sizeof(server_ip),
				                   &conn->client.lsa);

				server_domain = server_ip;
			}

			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
#if defined(USE_IPV6)
			            "%s://%s%s%s%s%s",
			            proto,
			            (is_ipv6 && (server_domain == server_ip)) ? "[" : "",
			            server_domain,
			            (is_ipv6 && (server_domain == server_ip)) ? "]" : "",
#else
			            "%s://%s%s%s",
			            proto,
			            server_domain,
#endif
			            portstr,
			            uri_encoded);

			mg_free(uri_encoded);
			if (truncated) {
				return -1;
			}
			return 0;
		}
	}
}